

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::UndoReadFromDisk(BlockManager *this,CBlockUndo *blockundo,CBlockIndex *index)

{
  long lVar1;
  bool bVar2;
  FlatFilePos FVar3;
  bool bVar4;
  HashVerifier<AutoFile> *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  AutoFile filein;
  FlatFilePos pos;
  HashVerifier<AutoFile> verifier;
  uint256 hashChecksum;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&verifier,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
             ,0x2c1,false);
  FVar3 = CBlockIndex::GetUndoPos(index);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&verifier);
  pos = FVar3;
  OpenUndoFile(&filein,this,&pos,true);
  if (filein.m_file == (FILE *)0x0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1df916;
    FlatFilePos::ToString_abi_cxx11_((string *)&verifier,&pos);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function_00._M_str = "UndoReadFromDisk";
    logging_function_00._M_len = 0x10;
    LogPrintf_<char[17],std::__cxx11::string>
              (logging_function_00,source_file_00,0x2c6,MEMPOOL,0x6a1e53,"UndoReadFromDisk",
               (char (*) [17])&verifier,pbVar5);
    this_00 = &verifier;
  }
  else {
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    CSHA256::CSHA256((CSHA256 *)&verifier);
    verifier.m_source = &filein;
    CBlockIndex::GetBlockHash((uint256 *)&log_msg,index->pprev);
    base_blob<256U>::Serialize<HashWriter>((base_blob<256U> *)&log_msg,&verifier.super_HashWriter);
    Unserialize<HashVerifier<AutoFile>,CTxUndo,std::allocator<CTxUndo>>
              (&verifier,&blockundo->vtxundo);
    base_blob<256U>::Unserialize<AutoFile>(&hashChecksum.super_base_blob<256U>,&filein);
    HashWriter::GetHash((uint256 *)&log_msg,&verifier.super_HashWriter);
    bVar2 = operator!=(&hashChecksum.super_base_blob<256U>,(base_blob<256U> *)&log_msg);
    bVar4 = true;
    if (!bVar2) goto LAB_001df957;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1df8c5;
    FlatFilePos::ToString_abi_cxx11_(&log_msg,&pos);
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "UndoReadFromDisk";
    logging_function._M_len = 0x10;
    LogPrintf_<char[17],std::__cxx11::string>
              (logging_function,source_file,0x2d8,MEMPOOL,0x6a1e9c,"UndoReadFromDisk",
               (char (*) [17])&log_msg,pbVar5);
    this_00 = (HashVerifier<AutoFile> *)&log_msg;
  }
  std::__cxx11::string::~string((string *)this_00);
  bVar4 = false;
LAB_001df957:
  AutoFile::~AutoFile(&filein);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::UndoReadFromDisk(CBlockUndo& blockundo, const CBlockIndex& index) const
{
    const FlatFilePos pos{WITH_LOCK(::cs_main, return index.GetUndoPos())};

    // Open history file to read
    AutoFile filein{OpenUndoFile(pos, true)};
    if (filein.IsNull()) {
        LogError("%s: OpenUndoFile failed for %s\n", __func__, pos.ToString());
        return false;
    }

    // Read block
    uint256 hashChecksum;
    HashVerifier verifier{filein}; // Use HashVerifier as reserializing may lose data, c.f. commit d342424301013ec47dc146a4beb49d5c9319d80a
    try {
        verifier << index.pprev->GetBlockHash();
        verifier >> blockundo;
        filein >> hashChecksum;
    } catch (const std::exception& e) {
        LogError("%s: Deserialize or I/O error - %s at %s\n", __func__, e.what(), pos.ToString());
        return false;
    }

    // Verify checksum
    if (hashChecksum != verifier.GetHash()) {
        LogError("%s: Checksum mismatch at %s\n", __func__, pos.ToString());
        return false;
    }

    return true;
}